

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O2

int socketio_setoption(CONCRETE_IO_HANDLE socket_io,char *optionName,void *value)

{
  char cVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  int *piVar4;
  size_t sVar5;
  ushort **ppuVar6;
  int __optname;
  char *pcVar7;
  int iVar8;
  size_t __size;
  char *pcVar9;
  
  if (value == (void *)0x0 || (optionName == (char *)0x0 || socket_io == (CONCRETE_IO_HANDLE)0x0)) {
    return 0x4ba;
  }
  iVar2 = strcmp(optionName,"tcp_keepalive");
  if (iVar2 == 0) {
    iVar2 = *socket_io;
    iVar8 = 1;
    __optname = 9;
  }
  else {
    iVar2 = strcmp(optionName,"tcp_keepalive_time");
    if (iVar2 == 0) {
      iVar2 = *socket_io;
      iVar8 = 6;
      __optname = 4;
    }
    else {
      iVar2 = strcmp(optionName,"tcp_keepalive_interval");
      if (iVar2 != 0) {
        iVar2 = strcmp(optionName,"net_interface_mac_address");
        if (iVar2 == 0) {
          sVar5 = strlen((char *)value);
          if (sVar5 == 0) {
            p_Var3 = xlogging_get_log_function();
            iVar2 = 0x4dd;
            if (p_Var3 == (LOGGER_LOG)0x0) {
              return 0x4dd;
            }
            pcVar7 = "socketio_setoption";
            pcVar9 = "option value must be a valid mac address";
            iVar8 = 0x4dc;
          }
          else {
            __size = 0xffffffffffffffff;
            if (sVar5 + 1 != 0) {
              __size = sVar5 + 1;
            }
            if (__size == 0xffffffffffffffff) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                          ,"socketio_setoption",0x4e1,1,"invalid malloc size");
              }
              *(undefined8 *)((long)socket_io + 0x48) = 0;
              return 0x4e2;
            }
            pcVar7 = (char *)malloc(__size);
            *(char **)((long)socket_io + 0x48) = pcVar7;
            if (pcVar7 != (char *)0x0) {
              strcpy(pcVar7,(char *)value);
              for (; cVar1 = *pcVar7, cVar1 != '\0'; pcVar7 = pcVar7 + 1) {
                ppuVar6 = __ctype_b_loc();
                if ((~(*ppuVar6)[(int)cVar1] & 0x600) == 0) {
                  iVar2 = toupper((int)cVar1);
                  *pcVar7 = (char)iVar2;
                }
              }
              return 0;
            }
            p_Var3 = xlogging_get_log_function();
            iVar2 = 0x4e8;
            if (p_Var3 == (LOGGER_LOG)0x0) {
              return 0x4e8;
            }
            pcVar7 = "socketio_setoption";
            pcVar9 = "failed setting net_interface_mac_address option (malloc failed)";
            iVar8 = 0x4e7;
          }
        }
        else {
          iVar2 = strcmp(optionName,"ADDRESS_TYPE");
          if (iVar2 != 0) {
            return 0x4f8;
          }
          if (*(int *)((long)socket_io + 0x50) == 0) {
            iVar2 = strcmp((char *)value,"DOMAIN_SOCKET");
            if (iVar2 == 0) {
              *(undefined4 *)((long)socket_io + 4) = 1;
            }
            else {
              iVar2 = strcmp((char *)value,"IP_SOCKET");
              if (iVar2 != 0) {
                p_Var3 = xlogging_get_log_function();
                iVar2 = 0x4ac;
                if (p_Var3 == (LOGGER_LOG)0x0) {
                  return 0x4ac;
                }
                pcVar7 = "socketio_setaddresstype_option";
                pcVar9 = "Address type %s is not supported";
                iVar8 = 0x4ab;
                goto LAB_0010607f;
              }
              *(undefined4 *)((long)socket_io + 4) = 0;
            }
            return 0;
          }
          p_Var3 = xlogging_get_log_function();
          iVar2 = 0x49d;
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return 0x49d;
          }
          pcVar7 = "socketio_setaddresstype_option";
          pcVar9 = 
          "Socket\'s type can only be changed when in state \'IO_STATE_CLOSED\'.  Current state=%d";
          iVar8 = 0x49c;
        }
LAB_0010607f:
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                  ,pcVar7,iVar8,1,pcVar9);
        return iVar2;
      }
      iVar2 = *socket_io;
      iVar8 = 6;
      __optname = 5;
    }
  }
  iVar2 = setsockopt(iVar2,iVar8,__optname,value,4);
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
  }
  return iVar2;
}

Assistant:

int socketio_setoption(CONCRETE_IO_HANDLE socket_io, const char* optionName, const void* value)
{
    int result;

    if (socket_io == NULL ||
        optionName == NULL ||
        value == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SOCKET_IO_INSTANCE* socket_io_instance = (SOCKET_IO_INSTANCE*)socket_io;

        if (strcmp(optionName, "tcp_keepalive") == 0)
        {
            result = setsockopt(socket_io_instance->socket, SOL_SOCKET, SO_KEEPALIVE, value, sizeof(int));
            if (result == -1) result = errno;
        }
        else if (strcmp(optionName, "tcp_keepalive_time") == 0)
        {
#ifdef __APPLE__
            result = setsockopt(socket_io_instance->socket, IPPROTO_TCP, TCP_KEEPALIVE, value, sizeof(int));
#else
            result = setsockopt(socket_io_instance->socket, SOL_TCP, TCP_KEEPIDLE, value, sizeof(int));
#endif
            if (result == -1) result = errno;
        }
        else if (strcmp(optionName, "tcp_keepalive_interval") == 0)
        {
            result = setsockopt(socket_io_instance->socket, SOL_TCP, TCP_KEEPINTVL, value, sizeof(int));
            if (result == -1) result = errno;
        }
        else if (strcmp(optionName, OPTION_NET_INT_MAC_ADDRESS) == 0)
        {
#ifdef __APPLE__
            LogError("option not supported.");
            result = MU_FAILURE;
#else
            size_t malloc_size;
            if (strlen(value) == 0)
            {
                LogError("option value must be a valid mac address");
                result = MU_FAILURE;
            }
            else if ((malloc_size = safe_multiply_size_t(safe_add_size_t(strlen(value), 1), sizeof(char))) == SIZE_MAX)
            {
                LogError("invalid malloc size");
                result = MU_FAILURE;
                socket_io_instance->target_mac_address = NULL;
            }
            else if ((socket_io_instance->target_mac_address = (char*)malloc(malloc_size)) == NULL)
            {
                LogError("failed setting net_interface_mac_address option (malloc failed)");
                result = MU_FAILURE;
            }
            else
            {
                strcpy(socket_io_instance->target_mac_address, value);
                strtoup(socket_io_instance->target_mac_address);
                result = 0;
            }
#endif
        }
        else if (strcmp(optionName, OPTION_ADDRESS_TYPE) == 0)
        {
            result = socketio_setaddresstype_option(socket_io_instance, (const char*)value);
        }
        else
        {
            result = MU_FAILURE;
        }
    }

    return result;
}